

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraSublimeTextGenerator.cxx
# Opt level: O0

void __thiscall
cmExtraSublimeTextGenerator::AppendAllTargets
          (cmExtraSublimeTextGenerator *this,
          vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *lgs,cmMakefile *mf,
          cmGeneratedFileStream *fout,MapSourceFileFlags *sourceFileFlags)

{
  cmLocalGenerator *pcVar1;
  cmGeneratorTarget *this_00;
  MapSourceFileFlags *pMVar2;
  cmGeneratedFileStream *pcVar3;
  bool bVar4;
  __type _Var5;
  TargetType TVar6;
  string *psVar7;
  const_reference ppcVar8;
  char *pcVar9;
  char *pcVar10;
  reference ppcVar11;
  cmMakefile *pcVar12;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *this_01;
  reference ppcVar13;
  string *__rhs;
  long lVar14;
  undefined1 local_170 [8];
  string fastTarget;
  string targetName;
  cmGeneratorTarget *target;
  const_iterator __end2;
  const_iterator __begin2;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *__range2;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *targets;
  cmMakefile *makefile;
  cmLocalGenerator *lg;
  const_iterator __end1;
  const_iterator __begin1;
  vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *__range1;
  string local_d8;
  allocator<char> local_b1;
  string local_b0;
  string local_90 [8];
  string compiler;
  allocator<char> local_59;
  string local_58;
  string *local_38;
  string *make;
  MapSourceFileFlags *sourceFileFlags_local;
  cmGeneratedFileStream *fout_local;
  cmMakefile *mf_local;
  vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *lgs_local;
  cmExtraSublimeTextGenerator *this_local;
  
  make = (string *)sourceFileFlags;
  sourceFileFlags_local = (MapSourceFileFlags *)fout;
  fout_local = (cmGeneratedFileStream *)mf;
  mf_local = (cmMakefile *)lgs;
  lgs_local = (vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"CMAKE_MAKE_PROGRAM",&local_59);
  psVar7 = cmMakefile::GetRequiredDefinition(mf,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  local_38 = psVar7;
  std::__cxx11::string::string(local_90);
  bVar4 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::empty
                    ((vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *)mf_local);
  pMVar2 = sourceFileFlags_local;
  if (!bVar4) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"all",&local_b1);
    ppcVar8 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[]
                        ((vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *)mf_local
                         ,0);
    pcVar1 = *ppcVar8;
    pcVar9 = (char *)std::__cxx11::string::c_str();
    pcVar3 = fout_local;
    pcVar10 = (char *)std::__cxx11::string::c_str();
    AppendTarget(this,(cmGeneratedFileStream *)pMVar2,&local_b0,pcVar1,(cmGeneratorTarget *)0x0,
                 pcVar9,(cmMakefile *)pcVar3,pcVar10,(MapSourceFileFlags *)make,true);
    std::__cxx11::string::~string((string *)&local_b0);
    std::allocator<char>::~allocator(&local_b1);
    pMVar2 = sourceFileFlags_local;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8,"clean",(allocator<char> *)((long)&__range1 + 7));
    ppcVar8 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[]
                        ((vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *)mf_local
                         ,0);
    pcVar1 = *ppcVar8;
    pcVar9 = (char *)std::__cxx11::string::c_str();
    pcVar3 = fout_local;
    pcVar10 = (char *)std::__cxx11::string::c_str();
    AppendTarget(this,(cmGeneratedFileStream *)pMVar2,&local_d8,pcVar1,(cmGeneratorTarget *)0x0,
                 pcVar9,(cmMakefile *)pcVar3,pcVar10,(MapSourceFileFlags *)make,false);
    std::__cxx11::string::~string((string *)&local_d8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 7));
  }
  pcVar12 = mf_local;
  __end1 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::begin
                     ((vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *)mf_local);
  lg = (cmLocalGenerator *)
       std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::end
                 ((vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *)pcVar12);
  while (bVar4 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
                                     *)&lg), bVar4) {
    ppcVar11 = __gnu_cxx::
               __normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
               ::operator*(&__end1);
    pcVar1 = *ppcVar11;
    pcVar12 = cmLocalGenerator::GetMakefile(pcVar1);
    this_01 = cmLocalGenerator::GetGeneratorTargets(pcVar1);
    __end2 = std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::begin(this_01);
    target = (cmGeneratorTarget *)
             std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::end(this_01);
    while (bVar4 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<cmGeneratorTarget_*const_*,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                                       *)&target), bVar4) {
      ppcVar13 = __gnu_cxx::
                 __normal_iterator<cmGeneratorTarget_*const_*,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                 ::operator*(&__end2);
      this_00 = *ppcVar13;
      psVar7 = cmGeneratorTarget::GetName_abi_cxx11_(this_00);
      std::__cxx11::string::string((string *)(fastTarget.field_2._M_local_buf + 8),(string *)psVar7)
      ;
      TVar6 = cmGeneratorTarget::GetType(this_00);
      pMVar2 = sourceFileFlags_local;
      if (TVar6 < UTILITY) {
        pcVar9 = (char *)std::__cxx11::string::c_str();
        pcVar10 = (char *)std::__cxx11::string::c_str();
        AppendTarget(this,(cmGeneratedFileStream *)pMVar2,(string *)((long)&fastTarget.field_2 + 8),
                     pcVar1,this_00,pcVar9,pcVar12,pcVar10,(MapSourceFileFlags *)make,false);
        std::__cxx11::string::string
                  ((string *)local_170,(string *)(fastTarget.field_2._M_local_buf + 8));
        std::__cxx11::string::operator+=((string *)local_170,"/fast");
        pMVar2 = sourceFileFlags_local;
        pcVar9 = (char *)std::__cxx11::string::c_str();
        pcVar10 = (char *)std::__cxx11::string::c_str();
        AppendTarget(this,(cmGeneratedFileStream *)pMVar2,(string *)local_170,pcVar1,this_00,pcVar9,
                     pcVar12,pcVar10,(MapSourceFileFlags *)make,false);
        std::__cxx11::string::~string((string *)local_170);
      }
      else if (TVar6 == UTILITY) {
        lVar14 = std::__cxx11::string::find(fastTarget.field_2._M_local_buf + 8,0x77dcf0);
        if ((((lVar14 != 0) ||
             (bVar4 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)((long)&fastTarget.field_2 + 8),"Nightly"), !bVar4)) &&
            ((lVar14 = std::__cxx11::string::find(fastTarget.field_2._M_local_buf + 8,0x77dcf8),
             lVar14 != 0 ||
             (bVar4 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)((long)&fastTarget.field_2 + 8),"Continuous"), !bVar4))))
           && ((lVar14 = std::__cxx11::string::find(fastTarget.field_2._M_local_buf + 8,0x7563db),
               lVar14 != 0 ||
               (bVar4 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)((long)&fastTarget.field_2 + 8),"Experimental"), !bVar4))
              )) {
          pMVar2 = sourceFileFlags_local;
          pcVar9 = (char *)std::__cxx11::string::c_str();
          pcVar10 = (char *)std::__cxx11::string::c_str();
          AppendTarget(this,(cmGeneratedFileStream *)pMVar2,
                       (string *)((long)&fastTarget.field_2 + 8),pcVar1,(cmGeneratorTarget *)0x0,
                       pcVar9,pcVar12,pcVar10,(MapSourceFileFlags *)make,false);
        }
      }
      else if (TVar6 == GLOBAL_TARGET) {
        psVar7 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(pcVar1);
        __rhs = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_(pcVar1);
        _Var5 = std::operator==(psVar7,__rhs);
        pMVar2 = sourceFileFlags_local;
        if (_Var5) {
          pcVar9 = (char *)std::__cxx11::string::c_str();
          pcVar10 = (char *)std::__cxx11::string::c_str();
          AppendTarget(this,(cmGeneratedFileStream *)pMVar2,
                       (string *)((long)&fastTarget.field_2 + 8),pcVar1,(cmGeneratorTarget *)0x0,
                       pcVar9,pcVar12,pcVar10,(MapSourceFileFlags *)make,false);
        }
      }
      std::__cxx11::string::~string((string *)(fastTarget.field_2._M_local_buf + 8));
      __gnu_cxx::
      __normal_iterator<cmGeneratorTarget_*const_*,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
      ::operator++(&__end2);
    }
    __gnu_cxx::
    __normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
    ::operator++(&__end1);
  }
  std::__cxx11::string::~string(local_90);
  return;
}

Assistant:

void cmExtraSublimeTextGenerator::AppendAllTargets(
  const std::vector<cmLocalGenerator*>& lgs, const cmMakefile* mf,
  cmGeneratedFileStream& fout, MapSourceFileFlags& sourceFileFlags)
{
  const std::string& make = mf->GetRequiredDefinition("CMAKE_MAKE_PROGRAM");
  std::string compiler;
  if (!lgs.empty()) {
    this->AppendTarget(fout, "all", lgs[0], nullptr, make.c_str(), mf,
                       compiler.c_str(), sourceFileFlags, true);
    this->AppendTarget(fout, "clean", lgs[0], nullptr, make.c_str(), mf,
                       compiler.c_str(), sourceFileFlags, false);
  }

  // add all executable and library targets and some of the GLOBAL
  // and UTILITY targets
  for (cmLocalGenerator* lg : lgs) {
    cmMakefile* makefile = lg->GetMakefile();
    const std::vector<cmGeneratorTarget*>& targets = lg->GetGeneratorTargets();
    for (cmGeneratorTarget* target : targets) {
      std::string targetName = target->GetName();
      switch (target->GetType()) {
        case cmStateEnums::GLOBAL_TARGET: {
          // Only add the global targets from CMAKE_BINARY_DIR,
          // not from the subdirs
          if (lg->GetCurrentBinaryDirectory() == lg->GetBinaryDirectory()) {
            this->AppendTarget(fout, targetName, lg, nullptr, make.c_str(),
                               makefile, compiler.c_str(), sourceFileFlags,
                               false);
          }
        } break;
        case cmStateEnums::UTILITY:
          // Add all utility targets, except the Nightly/Continuous/
          // Experimental-"sub"targets as e.g. NightlyStart
          if (((targetName.find("Nightly") == 0) &&
               (targetName != "Nightly")) ||
              ((targetName.find("Continuous") == 0) &&
               (targetName != "Continuous")) ||
              ((targetName.find("Experimental") == 0) &&
               (targetName != "Experimental"))) {
            break;
          }

          this->AppendTarget(fout, targetName, lg, nullptr, make.c_str(),
                             makefile, compiler.c_str(), sourceFileFlags,
                             false);
          break;
        case cmStateEnums::EXECUTABLE:
        case cmStateEnums::STATIC_LIBRARY:
        case cmStateEnums::SHARED_LIBRARY:
        case cmStateEnums::MODULE_LIBRARY:
        case cmStateEnums::OBJECT_LIBRARY: {
          this->AppendTarget(fout, targetName, lg, target, make.c_str(),
                             makefile, compiler.c_str(), sourceFileFlags,
                             false);
          std::string fastTarget = targetName;
          fastTarget += "/fast";
          this->AppendTarget(fout, fastTarget, lg, target, make.c_str(),
                             makefile, compiler.c_str(), sourceFileFlags,
                             false);
        } break;
        default:
          break;
      }
    }
  }
}